

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicSSOCase3::Run(BasicSSOCase3 *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  GLuint GVar2;
  char *format;
  int data;
  char *glsl_b;
  char *glsl_a;
  
  glsl_a = 
  "#version 430 core\nlayout(local_size_x = 1) in;\nlayout(binding = 3, std430) buffer Output {\n  int g_output;\n};\nvoid main() {\n  g_output = 1;\n}"
  ;
  glsl_b = 
  "#version 430 core\nlayout(local_size_x = 1) in;\nlayout(binding = 3, std430) buffer Output {\n  int g_output;\n};\nvoid main() {\n  g_output = 2;\n}"
  ;
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  GVar2 = glu::CallLogWrapper::glCreateProgram(this_00);
  this->m_program_a = GVar2;
  GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x91b9);
  glu::CallLogWrapper::glAttachShader(this_00,this->m_program_a,GVar2);
  glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
  glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&glsl_a,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,GVar2);
  glu::CallLogWrapper::glProgramParameteri(this_00,this->m_program_a,0x8258,1);
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program_a);
  GVar2 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x91b9,1,&glsl_b);
  this->m_program_b = GVar2;
  data = 0;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,3,this->m_storage_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,4,&data,0x88e1);
  glu::CallLogWrapper::glGenProgramPipelines(this_00,1,&this->m_pipeline);
  glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,0xffffffff,this->m_program_b);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program_a);
  glu::CallLogWrapper::glBindProgramPipeline(this_00,this->m_pipeline);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,&data);
  if (data == 1) {
    glu::CallLogWrapper::glUseProgram(this_00,0);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,&data);
    if (data == 2) {
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program_b);
      glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,&data);
      if (data == 2) {
        glu::CallLogWrapper::glUseProgram(this_00,0);
        glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,0x20,this->m_program_a);
        glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,&data);
        iVar1 = data;
        if (data != 1) {
          anon_unknown_0::Output("Data is %d should be 1.\n",(ulong)(uint)data);
        }
        return -(ulong)(iVar1 != 1);
      }
    }
    format = "Data is %d should be 2.\n";
  }
  else {
    format = "Data is %d should be 1.\n";
  }
  anon_unknown_0::Output(format);
  return -1;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_a =
			"#version 430 core" NL "layout(local_size_x = 1) in;" NL "layout(binding = 3, std430) buffer Output {" NL
			"  int g_output;" NL "};" NL "void main() {" NL "  g_output = 1;" NL "}";

		const char* const glsl_b =
			"#version 430 core" NL "layout(local_size_x = 1) in;" NL "layout(binding = 3, std430) buffer Output {" NL
			"  int g_output;" NL "};" NL "void main() {" NL "  g_output = 2;" NL "}";

		/* create program A */
		{
			m_program_a = glCreateProgram();
			GLuint sh   = glCreateShader(GL_COMPUTE_SHADER);
			glAttachShader(m_program_a, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &glsl_a, NULL);
			glCompileShader(sh);
			glProgramParameteri(m_program_a, GL_PROGRAM_SEPARABLE, GL_TRUE);
			glLinkProgram(m_program_a);
		}
		m_program_b = glCreateShaderProgramv(GL_COMPUTE_SHADER, 1, &glsl_b);

		/* create storage buffer */
		{
			int data = 0;
			glGenBuffers(1, &m_storage_buffer);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(int), &data, GL_STREAM_READ);
		}

		glGenProgramPipelines(1, &m_pipeline);
		glUseProgramStages(m_pipeline, GL_ALL_SHADER_BITS, m_program_b);

		glUseProgram(m_program_a);
		glBindProgramPipeline(m_pipeline);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate */
		{
			int data;
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(int), &data);
			if (data != 1)
			{
				Output("Data is %d should be 1.\n", data);
				return ERROR;
			}
		}

		glUseProgram(0);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate */
		{
			int data;
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(int), &data);
			if (data != 2)
			{
				Output("Data is %d should be 2.\n", data);
				return ERROR;
			}
		}

		glUseProgram(m_program_b);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate */
		{
			int data;
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(int), &data);
			if (data != 2)
			{
				Output("Data is %d should be 2.\n", data);
				return ERROR;
			}
		}

		glUseProgram(0);
		glUseProgramStages(m_pipeline, GL_COMPUTE_SHADER_BIT, m_program_a);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate */
		{
			int data;
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(int), &data);
			if (data != 1)
			{
				Output("Data is %d should be 1.\n", data);
				return ERROR;
			}
		}

		return NO_ERROR;
	}